

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

int google::protobuf::anon_unknown_0::FieldSpaceUsed(FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  FieldOptions *pFVar4;
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = field;
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    CVar3 = FieldDescriptor::cpp_type(local_18);
    switch(CVar3) {
    case CPPTYPE_INT32:
      field_local._4_4_ = 0x10;
      break;
    case CPPTYPE_INT64:
      field_local._4_4_ = 0x10;
      break;
    case CPPTYPE_UINT32:
      field_local._4_4_ = 0x10;
      break;
    case CPPTYPE_UINT64:
      field_local._4_4_ = 0x10;
      break;
    case CPPTYPE_DOUBLE:
      field_local._4_4_ = 0x10;
      break;
    case CPPTYPE_FLOAT:
      field_local._4_4_ = 0x10;
      break;
    case CPPTYPE_BOOL:
      field_local._4_4_ = 0x10;
      break;
    case CPPTYPE_ENUM:
      field_local._4_4_ = 0x10;
      break;
    case CPPTYPE_STRING:
      pFVar4 = FieldDescriptor::options(local_18);
      FieldOptions::ctype(pFVar4);
      field_local._4_4_ = 0x18;
      break;
    case CPPTYPE_MESSAGE:
      bVar1 = IsMapFieldInApi(local_18);
      if (bVar1) {
        field_local._4_4_ = 0x48;
      }
      else {
        field_local._4_4_ = 0x18;
      }
      break;
    default:
switchD_00b0322d_default:
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/dynamic_message.cc"
                 ,0xa2);
      other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
      internal::LogFinisher::operator=(local_5d,other);
      internal::LogMessage::~LogMessage(&local_50);
      field_local._4_4_ = 0;
    }
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(local_18);
    switch(CVar3) {
    case CPPTYPE_INT32:
      field_local._4_4_ = 4;
      break;
    case CPPTYPE_INT64:
      field_local._4_4_ = 8;
      break;
    case CPPTYPE_UINT32:
      field_local._4_4_ = 4;
      break;
    case CPPTYPE_UINT64:
      field_local._4_4_ = 8;
      break;
    case CPPTYPE_DOUBLE:
      field_local._4_4_ = 8;
      break;
    case CPPTYPE_FLOAT:
      field_local._4_4_ = 4;
      break;
    case CPPTYPE_BOOL:
      field_local._4_4_ = 1;
      break;
    case CPPTYPE_ENUM:
      field_local._4_4_ = 4;
      break;
    case CPPTYPE_STRING:
      pFVar4 = FieldDescriptor::options(local_18);
      FieldOptions::ctype(pFVar4);
      field_local._4_4_ = 8;
      break;
    case CPPTYPE_MESSAGE:
      field_local._4_4_ = 8;
      break;
    default:
      goto switchD_00b0322d_default;
    }
  }
  return field_local._4_4_;
}

Assistant:

int FieldSpaceUsed(const FieldDescriptor* field) {
  typedef FieldDescriptor FD;  // avoid line wrapping
  if (field->label() == FD::LABEL_REPEATED) {
    switch (field->cpp_type()) {
      case FD::CPPTYPE_INT32  : return sizeof(RepeatedField<int32   >);
      case FD::CPPTYPE_INT64  : return sizeof(RepeatedField<int64   >);
      case FD::CPPTYPE_UINT32 : return sizeof(RepeatedField<uint32  >);
      case FD::CPPTYPE_UINT64 : return sizeof(RepeatedField<uint64  >);
      case FD::CPPTYPE_DOUBLE : return sizeof(RepeatedField<double  >);
      case FD::CPPTYPE_FLOAT  : return sizeof(RepeatedField<float   >);
      case FD::CPPTYPE_BOOL   : return sizeof(RepeatedField<bool    >);
      case FD::CPPTYPE_ENUM   : return sizeof(RepeatedField<int     >);
      case FD::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          return sizeof(DynamicMapField);
        } else {
          return sizeof(RepeatedPtrField<Message>);
        }

      case FD::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            return sizeof(RepeatedPtrField<string>);
        }
        break;
    }
  } else {
    switch (field->cpp_type()) {
      case FD::CPPTYPE_INT32  : return sizeof(int32   );
      case FD::CPPTYPE_INT64  : return sizeof(int64   );
      case FD::CPPTYPE_UINT32 : return sizeof(uint32  );
      case FD::CPPTYPE_UINT64 : return sizeof(uint64  );
      case FD::CPPTYPE_DOUBLE : return sizeof(double  );
      case FD::CPPTYPE_FLOAT  : return sizeof(float   );
      case FD::CPPTYPE_BOOL   : return sizeof(bool    );
      case FD::CPPTYPE_ENUM   : return sizeof(int     );

      case FD::CPPTYPE_MESSAGE:
        return sizeof(Message*);

      case FD::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            return sizeof(ArenaStringPtr);
        }
        break;
    }
  }

  GOOGLE_LOG(DFATAL) << "Can't get here.";
  return 0;
}